

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_typetraits.cpp
# Opt level: O2

void __thiscall
MxxExperimentalTypeTraits_const_typed_member_function_Test::TestBody
          (MxxExperimentalTypeTraits_const_typed_member_function_Test *this)

{
  AssertionResult gtest_ar_;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_18);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_18);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_18);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_18);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_18);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_18);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_18);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_18);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_18);
  local_18.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_18);
  return;
}

Assistant:

TEST(MxxExperimentalTypeTraits, const_typed_member_function) {
    // classes with member function `void(int) const`
    EXPECT_TRUE((has_member_function_test_member<const nonstatic_func,void(int) const>::value));
    EXPECT_TRUE((has_member_function_test_member<multiple_funcs,void(int) const>::value));
    EXPECT_TRUE((has_member_function_test_member<multi_mixed_funcs,void(int) const>::value));

    // classes without member function `void(int) const`
    EXPECT_FALSE((has_member_function_test_member<static_obj,void(int) const>::value));
    EXPECT_FALSE((has_member_function_test_member<static_const_obj,void(int) const>::value));
    EXPECT_FALSE((has_member_function_test_member<static_constexpr_obj,void(int) const>::value));
    EXPECT_FALSE((has_member_function_test_member<no_member,void(int) const>::value));
    EXPECT_FALSE((has_member_function_test_member<static_func, void(int) const>::value));
    EXPECT_FALSE((has_member_function_test_member<multiple_static_funcs, void(int) const>::value));
    EXPECT_FALSE((has_member_function_test_member<nonstatic_obj,void(int) const>::value));
}